

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

uchar * __thiscall
gl4cts::TextureViewTestCoherency::getStaticColorTextureData
          (TextureViewTestCoherency *this,uint width,uint height)

{
  uint uVar1;
  undefined4 uVar2;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  
  uVar1 = this->m_texture_n_components;
  iVar7 = uVar1 * width;
  puVar3 = (uchar *)operator_new__((ulong)(iVar7 * height));
  uVar2 = *(undefined4 *)this->m_static_color_byte;
  for (uVar4 = 0; uVar4 != height; uVar4 = uVar4 + 1) {
    uVar5 = 0;
    uVar6 = (ulong)width;
    while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
      *(undefined4 *)(puVar3 + uVar5 + (uint)(iVar7 * (int)uVar4)) = uVar2;
      uVar5 = (ulong)((int)uVar5 + uVar1);
    }
  }
  return puVar3;
}

Assistant:

unsigned char* TextureViewTestCoherency::getStaticColorTextureData(unsigned int width, unsigned int height) const
{
	/* Prepare the data buffer storing the data we want to replace the region of the
	 * data source with.
	 */
	unsigned char* result_ptr = new unsigned char[width * height * m_texture_n_components];

	for (unsigned int y = 0; y < height; ++y)
	{
		unsigned char* row_data_ptr = result_ptr + y * width * m_texture_n_components;

		for (unsigned int x = 0; x < width; ++x)
		{
			unsigned char* pixel_data_ptr = row_data_ptr + x * m_texture_n_components;

			memcpy(pixel_data_ptr, m_static_color_byte, sizeof(m_static_color_byte));
		} /* for (all columns) */
	}	 /* for (all rows) */

	return result_ptr;
}